

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_init_ex
                    (ma_audio_buffer_config *pConfig,ma_bool32 doCopy,ma_audio_buffer *pAudioBuffer)

{
  ma_format mVar1;
  ma_uint32 mVar2;
  long lVar3;
  void *pData_00;
  ma_audio_buffer_ref *in_RDX;
  int in_ESI;
  ma_format *in_RDI;
  void *pData;
  ma_uint64 allocationSizeInBytes;
  ma_result result;
  undefined8 sz;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  ma_format in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ma_result mVar4;
  ma_allocation_callbacks *pDst;
  
  if (in_RDX == (ma_audio_buffer_ref *)0x0) {
    mVar4 = MA_INVALID_ARGS;
  }
  else {
    pDst = (ma_allocation_callbacks *)0x97;
    if (in_RDX != (ma_audio_buffer_ref *)0x0) {
      memset(in_RDX,0,0x97);
    }
    if (in_RDI == (ma_format *)0x0) {
      mVar4 = MA_INVALID_ARGS;
    }
    else if (*(undefined8 *)(in_RDI + 4) == ma_format_unknown) {
      mVar4 = MA_INVALID_ARGS;
    }
    else {
      mVar4 = ma_audio_buffer_ref_init
                        (in_stack_ffffffffffffffe0,(ma_uint32)((ulong)in_RDI >> 0x20),
                         (void *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(ma_uint64)in_RDX,
                         (ma_audio_buffer_ref *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (mVar4 == MA_SUCCESS) {
        in_RDX->sampleRate = in_RDI[2];
        ma_allocation_callbacks_init_copy
                  (pDst,(ma_allocation_callbacks *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        if (in_ESI == 0) {
          ma_audio_buffer_ref_set_data(in_RDX,*(void **)(in_RDI + 6),*(undefined8 *)(in_RDI + 4));
          *(undefined4 *)&in_RDX[1].ds.loopEndInFrames = 0;
        }
        else {
          sz = *(undefined8 *)(in_RDI + 4);
          mVar1 = in_RDI[1];
          mVar2 = ma_get_bytes_per_sample(*in_RDI);
          lVar3 = sz * (ulong)(mVar2 * mVar1);
          pData_00 = ma_malloc(sz,(ma_allocation_callbacks *)0x232bb0);
          if (pData_00 == (void *)0x0) {
            return MA_OUT_OF_MEMORY;
          }
          if (*(undefined8 *)(in_RDI + 6) == ma_format_unknown) {
            ma_silence_pcm_frames
                      (in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                       (ma_format)((ulong)in_RDX >> 0x20),(ma_uint32)in_RDX);
          }
          else {
            ma_copy_pcm_frames((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDX,
                               CONCAT44(mVar4,in_stack_ffffffffffffffc0),
                               (ma_format)((ulong)lVar3 >> 0x20),(ma_uint32)lVar3);
          }
          ma_audio_buffer_ref_set_data(in_RDX,pData_00,*(undefined8 *)(in_RDI + 4));
          *(undefined4 *)&in_RDX[1].ds.loopEndInFrames = 1;
        }
        mVar4 = MA_SUCCESS;
      }
    }
  }
  return mVar4;
}

Assistant:

static ma_result ma_audio_buffer_init_ex(const ma_audio_buffer_config* pConfig, ma_bool32 doCopy, ma_audio_buffer* pAudioBuffer)
{
    ma_result result;

    if (pAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_MEMORY(pAudioBuffer, sizeof(*pAudioBuffer) - sizeof(pAudioBuffer->_pExtraData));   /* Safety. Don't overwrite the extra data. */

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->sizeInFrames == 0) {
        return MA_INVALID_ARGS; /* Not allowing buffer sizes of 0 frames. */
    }

    result = ma_audio_buffer_ref_init(pConfig->format, pConfig->channels, NULL, 0, &pAudioBuffer->ref);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* TODO: Version 0.12. Set this in ma_audio_buffer_ref_init() instead of here. */
    pAudioBuffer->ref.sampleRate = pConfig->sampleRate;

    ma_allocation_callbacks_init_copy(&pAudioBuffer->allocationCallbacks, &pConfig->allocationCallbacks);

    if (doCopy) {
        ma_uint64 allocationSizeInBytes;
        void* pData;

        allocationSizeInBytes = pConfig->sizeInFrames * ma_get_bytes_per_frame(pConfig->format, pConfig->channels);
        if (allocationSizeInBytes > MA_SIZE_MAX) {
            return MA_OUT_OF_MEMORY;    /* Too big. */
        }

        pData = ma_malloc((size_t)allocationSizeInBytes, &pAudioBuffer->allocationCallbacks);   /* Safe cast to size_t. */
        if (pData == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        if (pConfig->pData != NULL) {
            ma_copy_pcm_frames(pData, pConfig->pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
        } else {
            ma_silence_pcm_frames(pData, pConfig->sizeInFrames, pConfig->format, pConfig->channels);
        }

        ma_audio_buffer_ref_set_data(&pAudioBuffer->ref, pData, pConfig->sizeInFrames);
        pAudioBuffer->ownsData = MA_TRUE;
    } else {
        ma_audio_buffer_ref_set_data(&pAudioBuffer->ref, pConfig->pData, pConfig->sizeInFrames);
        pAudioBuffer->ownsData = MA_FALSE;
    }

    return MA_SUCCESS;
}